

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

boolean ecx_poperror(ecx_contextt *context,ec_errort *Ec)

{
  ec_timet *peVar1;
  bool bVar2;
  boolean notEmpty;
  ec_errort *Ec_local;
  ecx_contextt *context_local;
  
  bVar2 = context->elist->head != context->elist->tail;
  peVar1 = &context->elist->Error[context->elist->tail].Time;
  Ec->Time = *peVar1;
  *(ec_timet *)&Ec->Signal = peVar1[1];
  *(ec_timet *)&Ec->Etype = peVar1[2];
  *(uint32 *)((long)&Ec->field_6 + 4) = peVar1[3].sec;
  context->elist->Error[context->elist->tail].Signal = '\0';
  if (bVar2) {
    context->elist->tail = context->elist->tail + 1;
    if (0x40 < context->elist->tail) {
      context->elist->tail = 0;
    }
  }
  else {
    *context->ecaterror = '\0';
  }
  return bVar2;
}

Assistant:

boolean ecx_poperror(ecx_contextt *context, ec_errort *Ec)
{
   boolean notEmpty = (context->elist->head != context->elist->tail);

   *Ec = context->elist->Error[context->elist->tail];
   context->elist->Error[context->elist->tail].Signal = FALSE;
   if (notEmpty)
   {
      context->elist->tail++;
      if (context->elist->tail > EC_MAXELIST)
      {
         context->elist->tail = 0;
      }
   }
   else
   {
      *(context->ecaterror) = FALSE;
   }
   return notEmpty;
}